

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O3

void EVP_PKEY_free(EVP_PKEY *pkey)

{
  code *pcVar1;
  int iVar2;
  
  if (pkey != (EVP_PKEY *)0x0) {
    iVar2 = CRYPTO_refcount_dec_and_test_zero((CRYPTO_refcount_t *)pkey);
    if (iVar2 != 0) {
      if ((pkey->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) &&
         (pcVar1 = *(code **)(pkey->ameth + 0xa0), pcVar1 != (code *)0x0)) {
        (*pcVar1)(pkey);
        *(undefined8 *)&pkey->references = 0;
        pkey->save_type = 0;
      }
      OPENSSL_free(pkey);
      return;
    }
  }
  return;
}

Assistant:

void EVP_PKEY_free(EVP_PKEY *pkey) {
  if (pkey == NULL) {
    return;
  }

  if (!CRYPTO_refcount_dec_and_test_zero(&pkey->references)) {
    return;
  }

  free_it(pkey);
  OPENSSL_free(pkey);
}